

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O3

void __thiscall MediaManager::Init(MediaManager *this)

{
  IContainedElement *pIVar1;
  int iVar2;
  IMedia *pIVar3;
  pointer ppIVar4;
  vector<IMedia_*,_std::allocator<IMedia_*>_> *this_00;
  vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> list_of_elements;
  IMedia *local_50;
  vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> local_48;
  
  ClearList(this);
  DataContainer::GetFileList(&local_48,this->container_);
  if (local_48.super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    this_00 = &this->media_list_;
    ppIVar4 = local_48.super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar2 = (*(*ppIVar4)->_vptr_IContainedElement[2])();
      switch(iVar2) {
      case 1:
        local_50 = (IMedia *)operator_new(0x10);
        local_50->type_ = 1;
        local_50->_vptr_IMedia = (_func_int **)&PTR_GetType_00182ab8;
        std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                  ((vector<IMedia*,std::allocator<IMedia*>> *)this_00,&local_50);
        break;
      case 3:
        pIVar3 = (IMedia *)operator_new(0x38);
        pIVar1 = *ppIVar4;
        pIVar3->type_ = 3;
        pIVar3->_vptr_IMedia = (_func_int **)&PTR_GetType_00182a10;
        pIVar3[1]._vptr_IMedia = (_func_int **)pIVar1;
        DiskBuilder::DiskBuilder((DiskBuilder *)&pIVar3[1].type_);
        local_50 = pIVar3;
        std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                  ((vector<IMedia*,std::allocator<IMedia*>> *)this_00,&local_50);
        break;
      case 4:
        local_50 = (IMedia *)operator_new(0x10);
        local_50->type_ = 4;
        local_50->_vptr_IMedia = (_func_int **)&PTR_GetType_00182a58;
        std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                  ((vector<IMedia*,std::allocator<IMedia*>> *)this_00,&local_50);
        break;
      case 5:
        local_50 = (IMedia *)operator_new(0x10);
        local_50->type_ = 5;
        local_50->_vptr_IMedia = (_func_int **)&PTR_GetType_00182ae8;
        std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                  ((vector<IMedia*,std::allocator<IMedia*>> *)this_00,&local_50);
        break;
      case 6:
        local_50 = (IMedia *)operator_new(0x10);
        local_50->type_ = 6;
        local_50->_vptr_IMedia = (_func_int **)&PTR_GetType_00182a88;
        std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                  ((vector<IMedia*,std::allocator<IMedia*>> *)this_00,&local_50);
        break;
      case 8:
        local_50 = (IMedia *)operator_new(0x10);
        local_50->type_ = 8;
        local_50->_vptr_IMedia = (_func_int **)&PTR_GetType_00182b18;
        std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                  ((vector<IMedia*,std::allocator<IMedia*>> *)this_00,&local_50);
      }
      ppIVar4 = ppIVar4 + 1;
    } while (ppIVar4 !=
             local_48.super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MediaManager::Init()
{
   ClearList();

   std::vector<IContainedElement*> list_of_elements = container_->GetFileList();

   // Check buffer :
   for (auto& list_of_element : list_of_elements)
   {
      const int type = list_of_element->GetType();

      // Add a media type
      switch (type)
      {
      case MEDIA_DISK:
         media_list_.push_back(new Disk(type, list_of_element));
         break;
      case MEDIA_TAPE:
         media_list_.push_back(new Tape(type));
         break;
      case MEDIA_BIN:
         media_list_.push_back(new Binary(type));
         break;
      case MEDIA_SNA:
         media_list_.push_back(new Snapshot(type));
         break;
      case MEDIA_SNR:
         media_list_.push_back(new SnapshotReplay(type));
         break;
      case MEDIA_CPR:
         media_list_.push_back(new CPR(type));
         break;
      default: // unhandled type
         break;
      }
   }
}